

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonAncestors
          (DOMRangeImpl *this,DOMNode *startAncestor,DOMNode *endAncestor,int how)

{
  int iVar1;
  undefined4 extraout_var;
  DOMNode *pDVar2;
  undefined4 extraout_var_00;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *nextSibling;
  DOMNode *sibling;
  int cnt;
  XMLSize_t endOffset;
  XMLSize_t startOffset;
  DOMNode *commonParent;
  DOMNode *n;
  DOMDocumentFragment *frag;
  int how_local;
  DOMNode *endAncestor_local;
  DOMNode *startAncestor_local;
  DOMRangeImpl *this_local;
  
  n = (DOMNode *)0x0;
  if (how != 3) {
    iVar1 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    n = (DOMNode *)CONCAT44(extraout_var,iVar1);
  }
  pDVar2 = traverseLeftBoundary(this,startAncestor,how);
  if (n != (DOMNode *)0x0) {
    (*n->_vptr_DOMNode[0x11])(n,pDVar2);
  }
  iVar1 = (*startAncestor->_vptr_DOMNode[5])();
  XVar3 = indexOf(this,startAncestor,(DOMNode *)CONCAT44(extraout_var_00,iVar1));
  XVar4 = indexOf(this,endAncestor,(DOMNode *)CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*startAncestor->_vptr_DOMNode[10])();
  nextSibling = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
  for (sibling._4_4_ = (int)XVar4 - ((int)XVar3 + 1); 0 < sibling._4_4_;
      sibling._4_4_ = sibling._4_4_ + -1) {
    iVar1 = (*nextSibling->_vptr_DOMNode[10])();
    pDVar2 = traverseFullySelected(this,nextSibling,how);
    if (n != (DOMNode *)0x0) {
      (*n->_vptr_DOMNode[0x11])(n,pDVar2);
    }
    nextSibling = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
  }
  pDVar2 = traverseRightBoundary(this,endAncestor,how);
  if (n != (DOMNode *)0x0) {
    (*n->_vptr_DOMNode[0x11])(n,pDVar2);
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return (DOMDocumentFragment *)n;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonAncestors( DOMNode*startAncestor, DOMNode*endAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();

    DOMNode*n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );

    DOMNode*commonParent = startAncestor->getParentNode();
    XMLSize_t startOffset = indexOf( startAncestor, commonParent );
    XMLSize_t endOffset = indexOf( endAncestor, commonParent );
    ++startOffset;

    int cnt = (int)endOffset - (int)startOffset;
    DOMNode* sibling = startAncestor->getNextSibling();

    while( cnt > 0 )
    {
        DOMNode* nextSibling = sibling->getNextSibling();
        n = traverseFullySelected( sibling, how );
        if ( frag!=0 )
            frag->appendChild( n );
        sibling = nextSibling;
        --cnt;
    }

    n = traverseRightBoundary( endAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }
    return frag;
}